

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingExample.cpp
# Opt level: O3

double GetMapping<double>(double mapMe,vector<double,_std::allocator<double>_> *mappings)

{
  double dVar1;
  pointer pdVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mapping range: ",0xf);
  pdVar2 = (mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    uVar5 = 0;
    do {
      poVar3 = std::ostream::_M_insert<double>(pdVar2[uVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      uVar5 = uVar5 + 1;
      pdVar2 = (mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(mappings->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pdVar2 = (mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  dVar6 = mapMe;
  if (lVar4 != 0) {
    uVar5 = 0;
    do {
      dVar1 = pdVar2[uVar5];
      if (dVar1 >= mapMe) {
        dVar6 = dVar1;
      }
      uVar5 = (ulong)((int)uVar5 + (uint)(dVar1 < mapMe));
    } while ((uVar5 < (ulong)(lVar4 >> 3)) && (dVar1 < mapMe));
  }
  poVar3 = std::ostream::_M_insert<double>(mapMe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is mapped to ",0xe);
  poVar3 = std::ostream::_M_insert<double>(dVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return dVar6;
}

Assistant:

MapType GetMapping(MapType mapMe, vector<MapType> mappings){
   MapType result = mapMe;
   int i;
   bool keepLooking;

   keepLooking = true;

   cout << endl;
   cout << "Mapping range: ";
   for (i = 0; i < mappings.size(); ++i) {
      cout << mappings.at(i) << " ";
   }
   cout << endl;

   i = 0;       // Restart counting
   while ((i < mappings.size()) && keepLooking) {
      if(mapMe <= mappings.at(i)) {
         result = mappings.at(i);
         keepLooking = false;
      }
      else {
         ++i;
      }
   }

   cout << mapMe << " is mapped to " << result << endl;

   return result;
}